

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setStrAccumError(StrAccum *p,u8 eError)

{
  Parse *pPVar1;
  
  p->accError = eError;
  if (p->mxAlloc != 0) {
    sqlite3_str_reset(p);
  }
  if (((eError == '\x12') && (p->db != (sqlite3 *)0x0)) &&
     (pPVar1 = p->db->pParse, pPVar1 != (Parse *)0x0)) {
    pPVar1->rc = 0x12;
    pPVar1->nErr = pPVar1->nErr + 1;
  }
  return;
}

Assistant:

static void setStrAccumError(StrAccum *p, u8 eError){
  assert( eError==SQLITE_NOMEM || eError==SQLITE_TOOBIG );
  p->accError = eError;
  if( p->mxAlloc ) sqlite3_str_reset(p);
  if( eError==SQLITE_TOOBIG ) sqlite3ErrorToParser(p->db, eError);
}